

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

int Llb_Nonlin4NextPartitions(Llb_Mgr_t_conflict *p,Llb_Prt_t **ppPart1,Llb_Prt_t **ppPart2)

{
  Llb_Var_t *pLVar1;
  Llb_Prt_t *pLVar2;
  long lVar3;
  Llb_Prt_t *pLVar4;
  Llb_Prt_t *pLVar5;
  Llb_Var_t *pLVar6;
  long lVar7;
  Llb_Prt_t *pLVar8;
  Llb_Prt_t *pLVar9;
  
  Llb_Nonlin4CheckVars(p);
  if (0 < (long)p->nVars) {
    lVar3 = 0;
    pLVar6 = (Llb_Var_t *)0x0;
    do {
      pLVar1 = p->pVars[lVar3];
      if (((pLVar1 != (Llb_Var_t *)0x0) && ((p->nSizeMax == 0 || (pLVar1->nScore <= p->nSizeMax))))
         && ((pLVar6 == (Llb_Var_t *)0x0 || (pLVar1->nScore < pLVar6->nScore)))) {
        pLVar6 = pLVar1;
      }
      lVar3 = lVar3 + 1;
    } while (p->nVars != lVar3);
    if (pLVar6 != (Llb_Var_t *)0x0) {
      lVar3 = (long)pLVar6->vParts->nSize;
      if (lVar3 < 1) {
        pLVar5 = (Llb_Prt_t *)0x0;
        pLVar9 = (Llb_Prt_t *)0x0;
      }
      else {
        lVar7 = 0;
        pLVar4 = (Llb_Prt_t *)0x0;
        pLVar8 = (Llb_Prt_t *)0x0;
        do {
          pLVar2 = p->pParts[pLVar6->vParts->pArray[lVar7]];
          pLVar5 = pLVar2;
          pLVar9 = pLVar8;
          if ((pLVar4 != (Llb_Prt_t *)0x0) &&
             (pLVar5 = pLVar4, pLVar9 = pLVar2, pLVar8 != (Llb_Prt_t *)0x0)) {
            if (((pLVar2->nSize < pLVar4->nSize) || (pLVar9 = pLVar8, pLVar2->nSize < pLVar8->nSize)
                ) && (pLVar5 = pLVar2, pLVar9 = pLVar8, pLVar4->nSize <= pLVar8->nSize)) {
              pLVar5 = pLVar4;
              pLVar9 = pLVar2;
            }
          }
          lVar7 = lVar7 + 1;
          pLVar4 = pLVar5;
          pLVar8 = pLVar9;
        } while (lVar3 != lVar7);
      }
      *ppPart1 = pLVar5;
      *ppPart2 = pLVar9;
      return 1;
    }
  }
  return 0;
}

Assistant:

int Llb_Nonlin4NextPartitions( Llb_Mgr_t * p, Llb_Prt_t ** ppPart1, Llb_Prt_t ** ppPart2 )
{
    Llb_Var_t * pVar, * pVarBest = NULL;
    Llb_Prt_t * pPart, * pPart1Best = NULL, * pPart2Best = NULL;
    int i;
    Llb_Nonlin4CheckVars( p );
    // find variable with minimum score
    Llb_MgrForEachVar( p, pVar, i )
    {
        if ( p->nSizeMax && pVar->nScore > p->nSizeMax )
            continue;
//        if ( pVarBest == NULL || Vec_IntSize(pVarBest->vParts) * pVarBest->nScore > Vec_IntSize(pVar->vParts) * pVar->nScore )
        if ( pVarBest == NULL || pVarBest->nScore > pVar->nScore )
            pVarBest = pVar;
//        printf( "%d ", pVar->nScore );
    }
//printf( "\n" );
    if ( pVarBest == NULL )
        return 0;
    // find two partitions with minimum size
    Llb_VarForEachPart( p, pVarBest, pPart, i )
    {
        if ( pPart1Best == NULL )
            pPart1Best = pPart;
        else if ( pPart2Best == NULL )
            pPart2Best = pPart;
        else if ( pPart1Best->nSize > pPart->nSize || pPart2Best->nSize > pPart->nSize )
        {
            if ( pPart1Best->nSize > pPart2Best->nSize )
                pPart1Best = pPart;
            else
                pPart2Best = pPart;
        }
    }
//printf( "Selecting %d and parts %d and %d\n", pVarBest->iVar, pPart1Best->nSize, pPart2Best->nSize );
//Extra_bddPrintSupport( p->dd, pPart1Best->bFunc ); printf( "\n" );
//Extra_bddPrintSupport( p->dd, pPart2Best->bFunc ); printf( "\n" );

    *ppPart1 = pPart1Best;
    *ppPart2 = pPart2Best;
    return 1; 
}